

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O3

bool opts::Options::dashed_non_option(char *arg,IsShort *is_short)

{
  bool bVar1;
  char local_1;
  
  if ((*arg == '-') && (arg[1] == 0x2e || (int)arg[1] - 0x30U < 10)) {
    if ((is_short->super__Function_base)._M_manager != (_Manager_type)0x0) {
      bVar1 = (*is_short->_M_invoker)((_Any_data *)is_short,&local_1);
      return !bVar1;
    }
    std::__throw_bad_function_call();
  }
  return false;
}

Assistant:

static bool     dashed_non_option(char* arg, BasicOption::IsShort is_short)
    {
        return arg[ 0 ] == '-'
                && (std::isdigit(arg[ 1 ]) || arg[ 1 ] == '.')
                && !is_short(arg[ 1 ]);
    }